

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O2

string * __thiscall
vera::getLenticularFragShader_abi_cxx11_
          (string *__return_storage_ptr__,vera *this,size_t _versionNumber)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string getLenticularFragShader(size_t _versionNumber) {
    std::string rta = "";

    if (_versionNumber < 130)
        rta += lenticular_frag;
    else if (_versionNumber >= 130) 
        rta += lenticular_frag_300;

    return rta;
}